

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::outputStyleBoth(Binasc *this,ostream *out,istream *input)

{
  istream *piVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uchar asciiLine [256];
  char local_149;
  istream *local_148;
  Binasc *local_140;
  char local_138 [264];
  
  lVar7 = 0;
  local_140 = this;
  memset(local_138,0,0x100);
  bVar2 = std::istream::get();
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    iVar9 = 0;
    local_148 = input;
    do {
      iVar3 = (int)lVar7;
      if (iVar3 == 0) {
        local_138[0] = ';';
        local_149 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_149,1);
        iVar3 = 1;
      }
      uVar8 = (uint)bVar2;
      if (uVar8 < 0x10) {
        local_149 = '0';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_149,1);
      }
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)out,uVar8);
      local_149 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_149,1);
      iVar9 = iVar9 + 1;
      lVar6 = (long)iVar3;
      local_138[lVar6] = ' ';
      iVar3 = isprint(uVar8);
      if (iVar3 == 0) {
        bVar2 = 0x20;
      }
      local_138[lVar6 + 1] = bVar2;
      local_138[lVar6 + 2] = ' ';
      lVar7 = lVar6 + 3;
      if (local_140->m_maxLineBytes <= iVar9) {
        local_149 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_149,1);
        local_138[lVar6 + 3] = '\0';
        sVar5 = strlen(local_138);
        std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
        iVar9 = 0;
        lVar7 = 0;
      }
      piVar1 = local_148;
      bVar2 = std::istream::get();
    } while (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 2) == 0);
    if (iVar9 != 0) {
      local_149 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_149,1);
      local_138[(int)lVar7] = '\0';
      sVar5 = strlen(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(out,local_138,sVar5);
      local_149 = '\n';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_149,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  return 1;
}

Assistant:

int Binasc::outputStyleBoth(std::ostream& out, std::istream& input) {
	uchar asciiLine[256] = {0};    // storage for output line
	int currentByte = 0;           // current byte output in line
	int index = 0;                 // current character in asciiLine
	uchar ch;                      // current input byte

	ch = static_cast<uchar>(input.get());
	while (!input.eof()) {
		if (index == 0) {
			asciiLine[index++] = ';';
			out << ' ';
		}
		if (ch < 0x10) {
			out << '0';
		}
		out << std::hex << (int)ch << ' ';
		currentByte++;

		asciiLine[index++] = ' ';
		if (isprint(ch)) {
			asciiLine[index++] = ch;
		} else {
			asciiLine[index++] = ' ';
		}
		asciiLine[index++] = ' ';

		if (currentByte >= m_maxLineBytes) {
			out << '\n';
			asciiLine[index] = '\0';
			out << asciiLine << "\n\n";
			currentByte = 0;
			index = 0;
		}
		ch = static_cast<uchar>(input.get());
	}

	if (currentByte != 0) {
		out << '\n';
		asciiLine[index] = '\0';
		out << asciiLine << '\n' << std::endl;
	}

	return 1;
}